

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::ScanLineInputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  pointer __src;
  pointer __dest;
  size_t __n;
  size_type __len;
  ulong uVar2;
  value_type *__val;
  V2f local_38;
  
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->partNumber = -1;
  this->memoryMapped = false;
  (this->optimizationMode)._optimizable = false;
  (this->optimizationData).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optimizationData).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimizationData).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 1;
  if (1 < numThreads * 2) {
    uVar2 = (ulong)(uint)(numThreads * 2);
  }
  __dest = (pointer)operator_new(uVar2 * 8);
  *__dest = (LineBuffer *)0x0;
  if ((int)uVar2 != 1) {
    memset(__dest + 1,0,uVar2 * 8 - 8);
  }
  __src = (this->lineBuffers).
          super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (0 < (long)__n) {
    memmove(__dest,__src,__n);
  }
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)(this->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
  }
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest + uVar2;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar2;
  return;
}

Assistant:

ScanLineInputFile::Data::Data (int numThreads):
        partNumber(-1),
        memoryMapped(false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers
    //

    lineBuffers.resize (max (1, 2 * numThreads));
}